

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void read_long_string(LexState *ls,SemInfo *seminfo,size_t sep)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  size_t sVar5;
  TString *pTVar6;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_3c;
  char *msg;
  char *what;
  int line;
  size_t sep_local;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  uVar1 = ls->linenumber;
  save(ls,ls->current);
  sVar5 = ls->z->n;
  ls->z->n = sVar5 - 1;
  if (sVar5 == 0) {
    local_3c = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_3c = (uint)*pbVar3;
  }
  ls->current = local_3c;
  if ((ls->current == 10) || (ls->current == 0xd)) {
    inclinenumber(ls);
  }
  do {
    while( true ) {
      while( true ) {
        iVar2 = ls->current;
        if (iVar2 == -1) {
          pcVar4 = "comment";
          if (seminfo != (SemInfo *)0x0) {
            pcVar4 = "string";
          }
          pcVar4 = luaO_pushfstring(ls->L,"unfinished long %s (starting at line %d)",pcVar4,
                                    (ulong)uVar1);
          lexerror(ls,pcVar4,0x120);
        }
        if ((iVar2 != 10) && (iVar2 != 0xd)) break;
        save(ls,10);
        inclinenumber(ls);
        if (seminfo == (SemInfo *)0x0) {
          ls->buff->n = 0;
        }
      }
      if (iVar2 == 0x5d) break;
      if (seminfo == (SemInfo *)0x0) {
        sVar5 = ls->z->n;
        ls->z->n = sVar5 - 1;
        if (sVar5 == 0) {
          local_4c = luaZ_fill(ls->z);
        }
        else {
          pbVar3 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar3 + 1);
          local_4c = (uint)*pbVar3;
        }
        ls->current = local_4c;
      }
      else {
        save(ls,ls->current);
        sVar5 = ls->z->n;
        ls->z->n = sVar5 - 1;
        if (sVar5 == 0) {
          local_48 = luaZ_fill(ls->z);
        }
        else {
          pbVar3 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar3 + 1);
          local_48 = (uint)*pbVar3;
        }
        ls->current = local_48;
      }
    }
    sVar5 = skip_sep(ls);
  } while (sVar5 != sep);
  save(ls,ls->current);
  sVar5 = ls->z->n;
  ls->z->n = sVar5 - 1;
  if (sVar5 == 0) {
    local_44 = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_44 = (uint)*pbVar3;
  }
  ls->current = local_44;
  if (seminfo != (SemInfo *)0x0) {
    pTVar6 = luaX_newstring(ls,ls->buff->buffer + sep,ls->buff->n + sep * -2);
    seminfo->ts = pTVar6;
  }
  return;
}

Assistant:

static void read_long_string (LexState *ls, SemInfo *seminfo, size_t sep) {
  int line = ls->linenumber;  /* initial line (for error message) */
  save_and_next(ls);  /* skip 2nd '[' */
  if (currIsNewline(ls))  /* string starts with a newline? */
    inclinenumber(ls);  /* skip it */
  for (;;) {
    switch (ls->current) {
      case EOZ: {  /* error */
        const char *what = (seminfo ? "string" : "comment");
        const char *msg = luaO_pushfstring(ls->L,
                     "unfinished long %s (starting at line %d)", what, line);
        lexerror(ls, msg, TK_EOS);
        break;  /* to avoid warnings */
      }
      case ']': {
        if (skip_sep(ls) == sep) {
          save_and_next(ls);  /* skip 2nd ']' */
          goto endloop;
        }
        break;
      }
      case '\n': case '\r': {
        save(ls, '\n');
        inclinenumber(ls);
        if (!seminfo) luaZ_resetbuffer(ls->buff);  /* avoid wasting space */
        break;
      }
      default: {
        if (seminfo) save_and_next(ls);
        else next(ls);
      }
    }
  } endloop:
  if (seminfo)
    seminfo->ts = luaX_newstring(ls, luaZ_buffer(ls->buff) + sep,
                                     luaZ_bufflen(ls->buff) - 2 * sep);
}